

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_function::preprocess
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  string *name;
  value_type ptVar1;
  token_base *ptVar2;
  size_t __n;
  pointer pbVar3;
  int iVar4;
  const_reference pptVar5;
  token_base **pptVar6;
  compile_error *pcVar7;
  internal_error *piVar8;
  pointer pbVar9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  size_t local_50;
  _func_int **local_48;
  _func_int **local_40;
  iterator local_38;
  
  pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar5;
  local_88._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
  if (*pptVar6 == (token_base *)0x0) {
    piVar8 = (internal_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Null pointer accessed.","");
    internal_error::internal_error(piVar8,(string *)local_88);
    __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_88._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
  iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
  if (iVar4 == 3) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
    pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_68);
    if (*(int *)&(*pptVar6)[1]._vptr_token_base == 0x27) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._0_8_ = tree_type<cs::token_base_*>::iterator::left((iterator *)&local_68);
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      if (*pptVar6 == (token_base *)0x0) {
        piVar8 = (internal_error *)__cxa_allocate_exception(0x28);
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Null pointer accessed.","");
        internal_error::internal_error(piVar8,(string *)local_88);
        __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
      }
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._0_8_ = tree_type<cs::token_base_*>::iterator::left((iterator *)&local_68);
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
      if (iVar4 != 4) {
        pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Wrong grammar for function definition, expect function name."
                   ,"");
        compile_error::compile_error(pcVar7,(string *)local_88);
        __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._0_8_ = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_68);
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      if (*pptVar6 == (token_base *)0x0) {
        piVar8 = (internal_error *)__cxa_allocate_exception(0x28);
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Null pointer accessed.","");
        internal_error::internal_error(piVar8,(string *)local_88);
        __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
      }
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ptVar1[1]._vptr_token_base;
      local_88._0_8_ = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_68);
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
      if (iVar4 != 0xd) {
        pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
        local_88._0_8_ = local_88 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Wrong grammar for function definition, expect argument list."
                   ,"");
        compile_error::compile_error(pcVar7,(string *)local_88);
        __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38.mData = (tree_node *)ptVar1[1]._vptr_token_base;
      local_88._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_38);
      pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      ptVar2 = *pptVar6;
      pp_Var11 = ptVar2[2]._vptr_token_base;
      pp_Var10 = ptVar2[4]._vptr_token_base;
      if (pp_Var11 != pp_Var10) {
        local_48 = ptVar2[3]._vptr_token_base;
        local_50 = ptVar2[3].line_num;
        local_40 = pp_Var10;
        do {
          local_88._0_8_ = *pp_Var11;
          pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
          if (*pptVar6 == (token_base *)0x0) {
            piVar8 = (internal_error *)__cxa_allocate_exception(0x28);
            local_88._0_8_ = local_88 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"Null pointer accessed.","");
            internal_error::internal_error(piVar8,(string *)local_88);
            __cxa_throw(piVar8,&internal_error::typeinfo,internal_error::~internal_error);
          }
          compiler_type::try_fix_this_deduction
                    ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->compiler).
                     super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (tree_node *)*pp_Var11);
          local_88._0_8_ = *pp_Var11;
          pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
          iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
          if (iVar4 == 4) {
            local_88._0_8_ = *pp_Var11;
            pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
            pbVar3 = local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            name = (string *)(*pptVar6 + 3);
            if (local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              __n = (*pptVar6)[3].line_num;
              pbVar9 = local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (pbVar9->_M_string_length == __n) {
                  if (__n == 0) {
LAB_0015d0b7:
                    pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
                    local_88._0_8_ = local_88 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_88,"Redefinition of function argument.","");
                    compile_error::compile_error(pcVar7,(string *)local_88);
                    __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
                  }
                  iVar4 = bcmp((pbVar9->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n);
                  if (iVar4 == 0) goto LAB_0015d0b7;
                }
                pbVar9 = pbVar9 + 1;
              } while (pbVar9 != pbVar3);
            }
            domain_manager::add_record
                      (&(((((context->
                            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->instance).
                          super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_runtime_type).storage,name);
            pp_Var10 = local_40;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_68,name);
          }
          else {
            local_88._0_8_ = *pp_Var11;
            pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
            iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
            if (iVar4 != 5) {
              pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
              local_88._0_8_ = local_88 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,"Unexpected element in function argument list.","");
              compile_error::compile_error(pcVar7,(string *)local_88);
              __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
            }
            local_88._0_8_ = *pp_Var11;
            pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
            if (local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
              local_88._0_8_ = local_88 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,
                         "Redefinition of function argument(Multi-define of vargs).","");
              compile_error::compile_error(pcVar7,(string *)local_88);
              __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
            }
            ptVar2 = *pptVar6;
            domain_manager::add_record
                      (&(((((context->
                            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->instance).
                          super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->super_runtime_type).storage,(string *)(ptVar2 + 1));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_68,(string *)(ptVar2 + 1));
          }
          pp_Var11 = pp_Var11 + 1;
          if (pp_Var11 == local_48) {
            pp_Var11 = *(_func_int ***)(local_50 + 8);
            local_50 = local_50 + 8;
            local_48 = pp_Var11 + 0x40;
          }
        } while (pp_Var11 != pp_Var10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      return;
    }
  }
  pcVar7 = (compile_error *)__cxa_allocate_exception(0x28);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Wrong grammar for function definition.","");
  compile_error::compile_error(pcVar7,(string *)local_88);
  __cxa_throw(pcVar7,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void method_function::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::signal ||
		        static_cast<token_signal *>(t.root().data())->get_signal() != signal_types::fcall_)
			throw compile_error("Wrong grammar for function definition.");
		if (t.root().left().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().left().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for function definition, expect function name.");
		if (t.root().right().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().right().data()->get_type() != token_types::arglist)
			throw compile_error("Wrong grammar for function definition, expect argument list.");
		std::vector<std::string> args;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data() == nullptr)
				throw internal_error("Null pointer accessed.");
			context->compiler->try_fix_this_deduction(it.root());
			if (it.root().data()->get_type() == token_types::id) {
				const std::string &str = static_cast<token_id *>(it.root().data())->get_id();
				for (auto &it: args)
					if (it == str)
						throw compile_error("Redefinition of function argument.");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else if (it.root().data()->get_type() == token_types::vargs) {
				const std::string &str = static_cast<token_vargs *>(it.root().data())->get_id();
				if (!args.empty())
					throw compile_error("Redefinition of function argument(Multi-define of vargs).");
				context->instance->storage.add_record(str);
				args.push_back(str);
			}
			else
				throw compile_error("Unexpected element in function argument list.");
		}
	}